

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O1

uint32_t ExtraCost_C(uint32_t *population,int length)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = population[5] + population[4];
  if (7 < length) {
    uVar2 = 4;
    if (4 < (uint)length >> 1) {
      uVar2 = (uint)length >> 1;
    }
    uVar3 = 2;
    do {
      uVar1 = uVar1 + (int)uVar3 * (population[uVar3 * 2 + 3] + population[uVar3 * 2 + 2]);
      uVar3 = uVar3 + 1;
    } while (uVar2 - 1 != uVar3);
  }
  return uVar1;
}

Assistant:

static uint32_t ExtraCost_C(const uint32_t* population, int length) {
  int i;
  uint32_t cost = population[4] + population[5];
  assert(length % 2 == 0);
  for (i = 2; i < length / 2 - 1; ++i) {
    cost += i * (population[2 * i + 2] + population[2 * i + 3]);
  }
  return cost;
}